

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translucent_shader.cpp
# Opt level: O3

void gen_translucent_shade
               (float *ca,float *cr,float *cl,float *cp,float *l,float *e,float *norm,float p,
               float x,float y,float ds,float dd,float depth,float *c)

{
  int i;
  long lVar1;
  int p_00;
  float fVar2;
  float fVar3;
  vec3 ci_total;
  vec3 ci;
  vec3 vthird;
  vec3 vsec;
  undefined8 local_100;
  float local_f8;
  float local_f0 [4];
  float local_e0 [4];
  float *local_d0;
  float local_c8;
  float local_b8;
  float *local_a8;
  float *local_a0;
  float *local_98;
  float local_8c [6];
  float afStack_74 [3];
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  
  local_d0 = (float *)CONCAT44(local_d0._4_4_,p);
  local_f0[3] = dd;
  local_c8 = ds;
  local_b8 = depth;
  local_a8 = e;
  local_a0 = ca;
  local_98 = cr;
  gen_lambert_shade(ca,cr,cl,norm,l,c);
  p_00 = (int)local_d0._0_4_;
  local_d0 = cp;
  gen_phong_shade(cl,cp,l,local_a8,norm,p_00,c);
  lVar1 = 0;
  do {
    c[lVar1] = c[lVar1] * local_f0[3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_e0[2] = 0.0;
  local_e0[0] = 0.0;
  local_e0[1] = 0.0;
  local_f0[0] = (float)*(undefined8 *)norm - local_c8;
  local_f0[1] = (float)((ulong)*(undefined8 *)norm >> 0x20) - local_b8;
  local_f0[2] = norm[2];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_f0[lVar1] * local_f0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    local_f0[lVar1] = local_f0[lVar1] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_48 = local_f0[1];
  fStack_44 = local_f0[2];
  local_58 = ZEXT416((uint)local_f0[0]);
  uStack_40 = 0;
  local_68 = local_f0[2];
  fStack_64 = local_f0[0];
  uStack_60 = 0;
  local_b8 = 0.0;
  do {
    fVar2 = (float)*(undefined8 *)(norm + 1);
    fVar3 = (float)((ulong)*(undefined8 *)(norm + 1) >> 0x20);
    local_100 = CONCAT44(fVar3 * fStack_64 - *norm * fStack_44,fVar2 * local_68 - fVar3 * local_48);
    local_f8 = *norm * local_48 - (float)local_58._0_4_ * fVar2;
    fVar2 = sinf(local_b8);
    lVar1 = 0;
    do {
      *(float *)((long)&local_100 + lVar1 * 4) = *(float *)((long)&local_100 + lVar1 * 4) * fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    fVar2 = cosf(local_b8);
    lVar1 = 0;
    do {
      local_8c[lVar1 + 6] = local_f0[lVar1] * fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_c8 = 0.0;
    lVar1 = 0;
    do {
      local_c8 = local_c8 + local_f0[lVar1] * norm[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    fVar2 = cosf(local_b8);
    local_c8 = local_c8 * (1.0 - fVar2);
    lVar1 = 0;
    do {
      local_8c[lVar1 + 3] = norm[lVar1] * local_c8;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    lVar1 = 0;
    do {
      *(float *)((long)&local_100 + lVar1 * 4) =
           *(float *)((long)&local_100 + lVar1 * 4) + local_8c[lVar1 + 6];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    lVar1 = 0;
    do {
      *(float *)((long)&local_100 + lVar1 * 4) =
           *(float *)((long)&local_100 + lVar1 * 4) + local_8c[lVar1 + 3];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    gen_lambert_shade(local_a0,local_98,cl,norm,(float *)&local_100,local_8c);
    gen_phong_shade(cl,local_d0,(float *)&local_100,local_a8,norm,p_00,local_8c);
    lVar1 = 0;
    do {
      local_e0[lVar1] = local_e0[lVar1] + local_8c[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_b8 = local_b8 + 1.0;
  } while (local_b8 < 6.2831855);
  lVar1 = 0;
  do {
    local_e0[lVar1] = local_e0[lVar1] * (1.0 - local_f0[3]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    c[lVar1] = c[lVar1] + local_e0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void gen_translucent_shade(const vec3 ca, const vec3 cr, const vec3 cl, const vec3 cp, vec3 l, const vec3 e, const vec3 norm, const float p,
float x, float y, const float ds, const float dd, const float depth, vec3 c){
    //cal diffuse and spec for inner and outer layer and blend
    gen_lambert_shade(ca, cr, cl, norm, l, c);
    gen_phong_shade(cl, cp, l, e, norm, p, c);
    vec3_scale(c, c, dd); //scale outer color by dimming with depth decay factor
    //apply BTDF to simulate a sum of subsurface source (a forward dipole)
    vec3 ci_total = {0.0f, 0.0f, 0.0f};

    vec3 vbase = {norm[0] - ds, norm[1] - depth, norm[2]}; //pick a subsurface source to start with, set our microfacet dipole to be ds unit away
    vec3_norm(vbase, vbase);
    //approximate an intergral of these subsurface sources
    for(float i = 0.0f; i < 2*PI; i+=1.0f){
        //find rotated vector around the normal by Rodrigue's rotation formula
        vec3 vrot;
        //first term
        vec3_mul_cross(vrot, norm, vbase);
        vec3_scale(vrot, vrot, sin(i));
        //second term
        vec3 vsec;
        vec3_scale(vsec, vbase, cos(i));
        //third term
        vec3 vthird;
        vec3_scale(vthird, norm, vec3_mul_inner(norm, vbase) * (1 - cos(i)) );
        //add and find rotated vec
        vec3_add(vrot, vrot, vsec);
        vec3_add(vrot, vrot, vthird);

        //calculate BTDF for this derivative
        vec3 ci;
        gen_lambert_shade(ca, cr, cl, norm, vrot, ci);
        gen_phong_shade(cl, cp, vrot, e, norm, p, ci);
        vec3_add(ci_total, ci_total, ci);
    }

    vec3_scale(ci_total, ci_total, 1 - dd); //preserve energy by culling with depth decay

    //composite
    vec3_add(c, c, ci_total);
}